

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O0

void __thiscall
btSpatialTransformationMatrix::transform<btSpatialMotionVector>
          (btSpatialTransformationMatrix *this,btSpatialMotionVector *inVec,
          btSpatialMotionVector *outVec,eOutputOperation outOp)

{
  int in_ECX;
  btVector3 *in_RDX;
  btVector3 bVar1;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  btScalar bVar2;
  btVector3 local_dc;
  btVector3 local_cc;
  undefined8 local_bc;
  undefined8 local_b4;
  undefined8 local_ac;
  undefined8 local_a4;
  undefined8 local_9c;
  undefined8 local_94;
  btVector3 local_8c;
  btVector3 local_7c;
  undefined8 local_6c;
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 local_54;
  undefined8 local_4c;
  undefined8 local_44;
  undefined8 local_2c;
  undefined8 uStack_24;
  btVector3 *local_18;
  
  local_18 = in_RDX;
  if (in_ECX == 0) {
    bVar1 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                        ,(btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
    ;
    uStack_24 = bVar1.m_floats._8_8_;
    local_2c = bVar1.m_floats._0_8_;
    *(undefined8 *)local_18->m_floats = local_2c;
    *(undefined8 *)(local_18->m_floats + 2) = uStack_24;
    bVar1 = btVector3::cross((btVector3 *)
                             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_54 = bVar1.m_floats._8_8_;
    local_5c = bVar1.m_floats._0_8_;
    bVar1 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_44 = bVar1.m_floats._8_8_;
    local_4c = bVar1.m_floats._0_8_;
    bVar1 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                        ,(btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
    ;
    local_64 = bVar1.m_floats._8_8_;
    local_6c = bVar1.m_floats._0_8_;
    bVar1 = operator+((btVector3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    *(long *)local_18[1].m_floats = bVar1.m_floats._0_8_;
    *(long *)(local_18[1].m_floats + 2) = bVar1.m_floats._8_8_;
  }
  else if (in_ECX == 1) {
    bVar1 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                        ,(btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
    ;
    local_7c.m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_7c.m_floats._0_8_ = bVar1.m_floats._0_8_;
    btVector3::operator+=(local_18,&local_7c);
    bVar1 = btVector3::cross((btVector3 *)
                             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_a4 = bVar1.m_floats._8_8_;
    local_ac = bVar1.m_floats._0_8_;
    bVar1 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_94 = bVar1.m_floats._8_8_;
    local_9c = bVar1.m_floats._0_8_;
    bVar1 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                        ,(btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
    ;
    local_b4 = bVar1.m_floats._8_8_;
    local_bc = bVar1.m_floats._0_8_;
    bVar1 = operator+((btVector3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_8c.m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_8c.m_floats._0_8_ = bVar1.m_floats._0_8_;
    btVector3::operator+=(local_18 + 1,&local_8c);
  }
  else if (in_ECX == 2) {
    bVar1 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                        ,(btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
    ;
    local_cc.m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_cc.m_floats._0_8_ = bVar1.m_floats._0_8_;
    btVector3::operator-=(local_18,&local_cc);
    bVar1 = btVector3::cross((btVector3 *)
                             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    bVar2 = bVar1.m_floats[0];
    operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    bVar1 = ::operator*((btMatrix3x3 *)CONCAT44(bVar2,in_stack_ffffffffffffff00),
                        (btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    bVar1 = operator+((btVector3 *)CONCAT44(bVar2,bVar1.m_floats[3]),bVar1.m_floats._4_8_);
    local_dc.m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_dc.m_floats._0_8_ = bVar1.m_floats._0_8_;
    btVector3::operator-=(local_18 + 1,&local_dc);
  }
  return;
}

Assistant:

void transform(	const SpatialVectorType &inVec,
                      SpatialVectorType &outVec,
					eOutputOperation outOp = None)
	{
		if(outOp == None)
		{
			outVec.m_topVec = m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec = -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		else if(outOp == Add)
		{
			outVec.m_topVec += m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec += -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		else if(outOp == Subtract)
		{
			outVec.m_topVec -= m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec -= -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		
	}